

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemerror.cpp
# Opt level: O1

QString * QSystemError::string(QString *__return_storage_ptr__,ErrorScope errorScope,int errorCode)

{
  if (errorScope - StandardLibraryError < 2) {
    standardLibraryErrorString(__return_storage_ptr__,errorCode);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"No error";
    (__return_storage_ptr__->d).size = 8;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QSystemError::string(ErrorScope errorScope, int errorCode)
{
    switch (errorScope) {
    case NativeError:
#if defined(Q_OS_WIN)
        return windowsErrorString(errorCode);
#endif // else unix: native and standard library are the same
    case StandardLibraryError:
        return standardLibraryErrorString(errorCode);
    default:
        qWarning("invalid error scope");
        Q_FALLTHROUGH();
    case NoError:
        return u"No error"_s;
    }
}